

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void eigensystem(double *mat,int N,double *eval,double *evec)

{
  double *e_00;
  double *e;
  double *evec_local;
  double *eval_local;
  int N_local;
  double *mat_local;
  
  e_00 = (double *)calloc((long)N,8);
  memcpy(evec,mat,(long)N * 8 * (long)N);
  tred2(evec,N,eval,e_00);
  tqli(eval,N,e_00,evec);
  free(e_00);
  return;
}

Assistant:

void eigensystem(double *mat, int N, double *eval, double *evec) {
	double *e;

	e = (double*)calloc(N, sizeof(double));

	memcpy(evec, mat, sizeof(double)*N*N);

	tred2(evec, N, eval, e);
	tqli(eval, N, e, evec);

	free(e);
}